

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O0

int lua_gc(lua_State *L,int what,int data)

{
  global_State *g_00;
  bool bVar1;
  l_mem local_30;
  lu_mem debt;
  global_State *g;
  int res;
  int data_local;
  int what_local;
  lua_State *L_local;
  
  g._4_4_ = 0;
  g_00 = L->l_G;
  switch(what) {
  case 0:
    g_00->gcrunning = '\0';
    break;
  case 1:
    luaE_setdebt(g_00,0);
    g_00->gcrunning = '\x01';
    break;
  case 2:
    luaC_fullgc(L,0);
    break;
  case 3:
    g._4_4_ = (uint)(g_00->totalbytes + g_00->GCdebt >> 10);
    break;
  case 4:
    g._4_4_ = (int)g_00->totalbytes + (int)g_00->GCdebt & 0x3ff;
    break;
  case 5:
    if (g_00->gckind == '\x02') {
      bVar1 = g_00->GCestimate == 0;
      luaC_forcestep(L);
    }
    else {
      local_30 = (long)data * 0x400 + -0x960;
      if (g_00->gcrunning != '\0') {
        local_30 = g_00->GCdebt + local_30;
      }
      luaE_setdebt(g_00,local_30);
      luaC_forcestep(L);
      bVar1 = g_00->gcstate == '\x05';
    }
    g._4_4_ = (uint)bVar1;
    break;
  case 6:
    g._4_4_ = g_00->gcpause;
    g_00->gcpause = data;
    break;
  case 7:
    g._4_4_ = g_00->gcstepmul;
    g_00->gcstepmul = data;
    break;
  case 8:
    g._4_4_ = g_00->gcmajorinc;
    g_00->gcmajorinc = data;
    break;
  case 9:
    g._4_4_ = (uint)g_00->gcrunning;
    break;
  case 10:
    luaC_changemode(L,2);
    break;
  case 0xb:
    luaC_changemode(L,0);
    break;
  default:
    g._4_4_ = 0xffffffff;
  }
  return g._4_4_;
}

Assistant:

LUA_API int lua_gc (lua_State *L, int what, int data) {
  int res = 0;
  global_State *g;
  lua_lock(L);
  g = G(L);
  switch (what) {
    case LUA_GCSTOP: {
      g->gcrunning = 0;
      break;
    }
    case LUA_GCRESTART: {
      luaE_setdebt(g, 0);
      g->gcrunning = 1;
      break;
    }
    case LUA_GCCOLLECT: {
      luaC_fullgc(L, 0);
      break;
    }
    case LUA_GCCOUNT: {
      /* GC values are expressed in Kbytes: #bytes/2^10 */
      res = cast_int(gettotalbytes(g) >> 10);
      break;
    }
    case LUA_GCCOUNTB: {
      res = cast_int(gettotalbytes(g) & 0x3ff);
      break;
    }
    case LUA_GCSTEP: {
      if (g->gckind == KGC_GEN) {  /* generational mode? */
        res = (g->GCestimate == 0);  /* true if it will do major collection */
        luaC_forcestep(L);  /* do a single step */
      }
      else {
       lu_mem debt = cast(lu_mem, data) * 1024 - GCSTEPSIZE;
       if (g->gcrunning)
         debt += g->GCdebt;  /* include current debt */
       luaE_setdebt(g, debt);
       luaC_forcestep(L);
       if (g->gcstate == GCSpause)  /* end of cycle? */
         res = 1;  /* signal it */
      }
      break;
    }
    case LUA_GCSETPAUSE: {
      res = g->gcpause;
      g->gcpause = data;
      break;
    }
    case LUA_GCSETMAJORINC: {
      res = g->gcmajorinc;
      g->gcmajorinc = data;
      break;
    }
    case LUA_GCSETSTEPMUL: {
      res = g->gcstepmul;
      g->gcstepmul = data;
      break;
    }
    case LUA_GCISRUNNING: {
      res = g->gcrunning;
      break;
    }
    case LUA_GCGEN: {  /* change collector to generational mode */
      luaC_changemode(L, KGC_GEN);
      break;
    }
    case LUA_GCINC: {  /* change collector to incremental mode */
      luaC_changemode(L, KGC_NORMAL);
      break;
    }
    default: res = -1;  /* invalid option */
  }
  lua_unlock(L);
  return res;
}